

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
gl3cts::TransformFeedbackOverflowQueryErrorNoActiveQuery::iterate
          (TransformFeedbackOverflowQueryErrorNoActiveQuery *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  GLuint i;
  uint uVar4;
  long lVar3;
  
  iVar2 = (*((this->super_TransformFeedbackOverflowQueryErrorBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (this->super_TransformFeedbackOverflowQueryErrorBase).m_case_name =
       "EndQuery[Indexed] must generate INVALID_OPERATION if <target> is TRANSFORM_FEEDBACK_OVERFLOW_ARB and there is no query active for TRANSFORM_FEEDBACK_OVERFLOW_ARB."
  ;
  (**(code **)(lVar3 + 0x628))(0x82ec);
  TransformFeedbackOverflowQueryErrorBase::verifyError
            (&this->super_TransformFeedbackOverflowQueryErrorBase,0x502);
  uVar4 = 0;
  (**(code **)(lVar3 + 0x630))(0x82ec,0);
  TransformFeedbackOverflowQueryErrorBase::verifyError
            (&this->super_TransformFeedbackOverflowQueryErrorBase,0x502);
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (bVar1) {
    (this->super_TransformFeedbackOverflowQueryErrorBase).m_case_name =
         "EndQuery[Indexed] must generate INVALID_OPERATION if <target> is TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB and there is no query active for TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB for the given index."
    ;
    for (; uVar4 < (this->super_TransformFeedbackOverflowQueryErrorBase).
                   super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams;
        uVar4 = uVar4 + 1) {
      if (uVar4 != this->m_active_query_stream_index) {
        (**(code **)(lVar3 + 0x630))(0x82ed,uVar4);
        TransformFeedbackOverflowQueryErrorBase::verifyError
                  (&this->super_TransformFeedbackOverflowQueryErrorBase,0x502);
        if (uVar4 == 0) {
          (**(code **)(lVar3 + 0x628))(0x82ed);
          TransformFeedbackOverflowQueryErrorBase::verifyError
                    (&this->super_TransformFeedbackOverflowQueryErrorBase,0x502);
        }
      }
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TransformFeedbackOverflowQueryErrorBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult iterate()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		startTest("EndQuery[Indexed] must generate INVALID_OPERATION if <target> is "
				  "TRANSFORM_FEEDBACK_OVERFLOW_ARB and there is no query active "
				  "for TRANSFORM_FEEDBACK_OVERFLOW_ARB.");

		gl.endQuery(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB);
		verifyError(GL_INVALID_OPERATION);
		gl.endQueryIndexed(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, 0);
		verifyError(GL_INVALID_OPERATION);

		if (supportsTransformFeedback3())
		{
			startTest("EndQuery[Indexed] must generate INVALID_OPERATION if <target> is "
					  "TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB and there is no query active "
					  "for TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB for the given index.");

			for (GLuint i = 0; i < getMaxVertexStreams(); ++i)
			{
				if (i != m_active_query_stream_index)
				{
					gl.endQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, i);
					verifyError(GL_INVALID_OPERATION);

					if (i == 0)
					{
						gl.endQuery(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB);
						verifyError(GL_INVALID_OPERATION);
					}
				}
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}